

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O0

void InitThingdef(void)

{
  PClass *pPVar1;
  FFlagDef *pFVar2;
  NativeCallType call;
  PStruct *pPVar3;
  int iVar4;
  uint uVar5;
  AActor **ppAVar6;
  PField *pPVar7;
  PNativeStruct *pPVar8;
  PType *pPVar9;
  PPointer *pPVar10;
  PArray *type;
  FAutoSegIterator *pFVar11;
  NCREGINFO pvVar12;
  FPropertyInfo **__base;
  AFuncDesc *pAVar13;
  VMNativeFunction *this;
  FieldDesc *pFVar14;
  FName *this_00;
  size_t sVar15;
  long lVar16;
  void **len;
  PInt *local_280;
  FieldDesc *afield;
  FAutoSegIterator probe_3;
  AFuncDesc *afunc;
  FAutoSegIterator probe_2;
  undefined1 local_150 [8];
  FAutoSegIterator probe_1;
  size_t i_1;
  FAutoSegIterator probe;
  FName local_110;
  int local_10c;
  FFlagList *pFStack_108;
  int i;
  FFlagList *fl;
  FFlagList *__end1;
  FFlagList *__begin1;
  FFlagList (*__range1) [7];
  FName local_e0;
  FName local_dc;
  FName local_d8;
  FName local_d4;
  FName local_d0;
  FName local_cc;
  FName local_c8;
  FName local_c4;
  PField *local_c0;
  PField *playerf;
  PArray *parray;
  PType *local_a8;
  PStruct *pstruct;
  PField *local_98;
  PField *dehf;
  PType *local_88;
  PStruct *dstruct;
  PField *local_78;
  PField *levelf;
  PType *local_68;
  PStruct *lstruct;
  PField *local_58;
  PField *multif;
  FName local_3c;
  PField *local_38;
  PField *vcf;
  PPointer *local_28;
  PPointer *sptr;
  PType *local_18;
  PStruct *sstruct;
  PType *TypeActor;
  
  sstruct = (PStruct *)NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
  FName::FName((FName *)((long)&sptr + 4),"Sector");
  local_18 = (PType *)NewNativeStruct((FName *)((long)&sptr + 4),(PTypeBase *)0x0);
  local_28 = NewPointer(local_18,false);
  pPVar9 = local_18;
  this_00 = (FName *)((long)&vcf + 4);
  FName::FName(this_00,"soundtarget");
  pPVar3 = sstruct;
  ppAVar6 = TObjPtr<AActor>::operator&((TObjPtr<AActor> *)0x110);
  (*(pPVar9->super_PTypeBase).super_DObject._vptr_DObject[0x16])
            (pPVar9,this_00,pPVar3,ppAVar6 + -1,0);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)this_00);
  FName::FName(&local_3c,"validcount");
  PField::PField(pPVar7,&local_3c,(PType *)TypeSInt32,0x2008,0xa1ffbc,0);
  local_38 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar7);
  FName::FName((FName *)((long)&lstruct + 4),"multiplayer");
  PField::PField(pPVar7,(FName *)((long)&lstruct + 4),(PType *)TypeBool,0x2018,0x1ae70bb,0);
  local_58 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  FName::FName((FName *)((long)&levelf + 4),"LevelLocals");
  sVar15 = 0;
  local_68 = (PType *)NewNativeStruct((FName *)((long)&levelf + 4),(PTypeBase *)0x0);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,sVar15);
  FName::FName((FName *)((long)&dstruct + 4),"level");
  PField::PField(pPVar7,(FName *)((long)&dstruct + 4),local_68,0x2008,0x1ae93f0,0);
  local_78 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  FName::FName((FName *)((long)&dehf + 4),"DehInfo");
  sVar15 = 0;
  local_88 = (PType *)NewNativeStruct((FName *)((long)&dehf + 4),(PTypeBase *)0x0);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,sVar15);
  FName::FName((FName *)((long)&pstruct + 4),"deh");
  PField::PField(pPVar7,(FName *)((long)&pstruct + 4),local_88,0x2008,0xa197e0,0);
  local_98 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  FName::FName((FName *)((long)&parray + 4),"PlayerInfo");
  local_a8 = (PType *)NewNativeStruct((FName *)((long)&parray + 4),(PTypeBase *)0x0);
  *(undefined4 *)&(local_a8->super_PTypeBase).super_DObject.field_0x24 = 0x2a0;
  local_a8->Align = 8;
  sVar15 = 8;
  playerf = (PField *)NewArray(local_a8,8);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,sVar15);
  FName::FName(&local_c4,"players");
  PField::PField(pPVar7,&local_c4,(PType *)playerf,0x2008,0x1ae70c0,0);
  local_c0 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  FName::FName(&local_c8,"Sector");
  pPVar8 = NewNativeStruct(&local_c8,(PTypeBase *)0x0);
  local_a8 = (PType *)pPVar8;
  FName::FName(&local_cc,"lines");
  FName::FName(&local_d0,"line");
  pPVar9 = (PType *)NewNativeStruct(&local_d0,(PTypeBase *)0x0);
  pPVar10 = NewPointer(pPVar9,false);
  type = NewArray((PType *)pPVar10,0x40000);
  pPVar10 = NewPointer((PType *)type,false);
  (**(code **)((long)(pPVar8->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                     super_PTypeBase.super_DObject._vptr_DObject + 0xb0))
            (pPVar8,&local_cc,pPVar10,0x1a0);
  sVar15 = 8;
  playerf = (PField *)NewArray((PType *)TypeBool,8);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,sVar15);
  FName::FName(&local_d4,"playeringame");
  PField::PField(pPVar7,&local_d4,(PType *)playerf,0x2018,0x1ae85c0,0);
  local_c0 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar7);
  FName::FName(&local_d8,"gameaction");
  PField::PField(pPVar7,&local_d8,(PType *)TypeUInt8,0x2008,0x1ae70a8,0);
  local_c0 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar7);
  FName::FName(&local_dc,"consoleplayer");
  PField::PField(pPVar7,&local_dc,(PType *)TypeSInt32,0x2018,0x1ae85c8,0);
  local_c0 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  if ((InitThingdef()::wpnochg == '\0') &&
     (iVar4 = __cxa_guard_acquire(&InitThingdef()::wpnochg), iVar4 != 0)) {
    InitThingdef::wpnochg = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    __cxa_guard_release(&InitThingdef()::wpnochg);
  }
  pPVar7 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar7);
  FName::FName(&local_e0,"WP_NOCHANGE");
  pPVar10 = NewPointer((PType *)AWeapon::RegistrationInfo.MyClass,false);
  PField::PField(pPVar7,&local_e0,(PType *)pPVar10,0x2018,0x1f7c160,0);
  local_c0 = pPVar7;
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar7);
  pPVar1 = AActor::RegistrationInfo.MyClass;
  FName::FName((FName *)((long)&__range1 + 4),"DecalGenerator");
  pPVar10 = NewPointer(&TypeVoid->super_PType,false);
  (**(code **)(*(long *)&(pPVar1->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb0))
            (pPVar1,(long)&__range1 + 4,pPVar10,0x478,0);
  __begin1 = FlagLists;
  fl = (FFlagList *)&DObject_GameType_Hook;
  for (__end1 = FlagLists; __end1 != fl; __end1 = __end1 + 1) {
    pFStack_108 = __end1;
    if ((__end1->Use & 2U) != 0) {
      for (local_10c = 0; local_10c < pFStack_108->NumDefs; local_10c = local_10c + 1) {
        if (0 < pFStack_108->Defs[local_10c].structoffset) {
          pPVar1 = *pFStack_108->Type;
          FStringf::FStringf((FStringf *)&probe.Tail,"b%s",pFStack_108->Defs[local_10c].name);
          FName::FName(&local_110,(FString *)&probe.Tail);
          if (pFStack_108->Defs[local_10c].fieldsize == 4) {
            local_280 = TypeSInt32;
          }
          else {
            local_280 = TypeSInt16;
          }
          pFVar2 = pFStack_108->Defs;
          lVar16 = (long)local_10c;
          (**(code **)(*(long *)&(pPVar1->super_PNativeStruct).super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.super_PTypeBase + 0xb0))
                    (pPVar1,&local_110,local_280,(long)pFVar2[lVar16].structoffset,
                     pFVar2[lVar16].varflags,pFVar2[lVar16].flagbit);
          FStringf::~FStringf((FStringf *)&probe.Tail);
        }
      }
    }
  }
  FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)&i_1,&CRegHead,&CRegTail);
  while( true ) {
    pFVar11 = FAutoSegIterator::operator++((FAutoSegIterator *)&i_1);
    pvVar12 = FAutoSegIterator::operator*(pFVar11);
    if (pvVar12 == (NCREGINFO)0x0) break;
    pvVar12 = FAutoSegIterator::operator*((FAutoSegIterator *)&i_1);
    if (*(long *)((long)pvVar12 + 0x30) != 0) {
      pvVar12 = FAutoSegIterator::operator*((FAutoSegIterator *)&i_1);
      (**(code **)((long)pvVar12 + 0x30))();
    }
  }
  for (probe_1.Tail = (REGINFO *)0x0; probe_1.Tail < (REGINFO *)0x7;
      probe_1.Tail = (REGINFO *)((long)probe_1.Tail + 1)) {
    qsort(FlagLists[(long)probe_1.Tail].Defs,(long)FlagLists[(long)probe_1.Tail].NumDefs,0x20,
          flagcmp);
  }
  uVar5 = TArray<FPropertyInfo_*,_FPropertyInfo_*>::Size(&properties);
  if (uVar5 == 0) {
    FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)local_150,&GRegHead,&GRegTail);
    while( true ) {
      pFVar11 = FAutoSegIterator::operator++((FAutoSegIterator *)local_150);
      pvVar12 = FAutoSegIterator::operator*(pFVar11);
      if (pvVar12 == (NCREGINFO)0x0) break;
      probe_2.Tail = (REGINFO *)FAutoSegIterator::operator*((FAutoSegIterator *)local_150);
      TArray<FPropertyInfo_*,_FPropertyInfo_*>::Push(&properties,(FPropertyInfo **)&probe_2.Tail);
    }
    TArray<FPropertyInfo_*,_FPropertyInfo_*>::ShrinkToFit(&properties);
    __base = TArray<FPropertyInfo_*,_FPropertyInfo_*>::operator[](&properties,0);
    uVar5 = TArray<FPropertyInfo_*,_FPropertyInfo_*>::Size(&properties);
    qsort(__base,(ulong)uVar5,8,propcmp);
  }
  TArray<AFuncDesc,_AFuncDesc>::Clear(&AFTable);
  uVar5 = TArray<AFuncDesc,_AFuncDesc>::Size(&AFTable);
  if (uVar5 == 0) {
    len = &ARegHead;
    FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)&afunc,&ARegHead,&ARegTail);
    while( true ) {
      pFVar11 = FAutoSegIterator::operator++((FAutoSegIterator *)&afunc);
      pvVar12 = FAutoSegIterator::operator*(pFVar11);
      if (pvVar12 == (NCREGINFO)0x0) break;
      pAVar13 = (AFuncDesc *)FAutoSegIterator::operator*((FAutoSegIterator *)&afunc);
      if (pAVar13->VMPointer == (VMNativeFunction **)0x0) {
        __assert_fail("afunc->VMPointer != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                      ,0x323,"void InitThingdef()");
      }
      this = (VMNativeFunction *)DObject::operator_new((DObject *)0x58,(size_t)len);
      call = pAVar13->Function;
      FName::FName((FName *)((long)&probe_3.Tail + 4),pAVar13->FuncName);
      VMNativeFunction::VMNativeFunction(this,call,(FName *)((long)&probe_3.Tail + 4));
      *pAVar13->VMPointer = this;
      FString::Format(&((*pAVar13->VMPointer)->super_VMFunction).PrintableName,"%s.%s [Native]",
                      pAVar13->ClassName + 1,pAVar13->FuncName);
      TArray<AFuncDesc,_AFuncDesc>::Push(&AFTable,pAVar13);
      len = &pAVar13->ClassName;
    }
    TArray<AFuncDesc,_AFuncDesc>::ShrinkToFit(&AFTable);
    pAVar13 = TArray<AFuncDesc,_AFuncDesc>::operator[](&AFTable,0);
    uVar5 = TArray<AFuncDesc,_AFuncDesc>::Size(&AFTable);
    qsort(pAVar13,(ulong)uVar5,0x20,funccmp);
  }
  TArray<FieldDesc,_FieldDesc>::Clear(&FieldTable);
  uVar5 = TArray<FieldDesc,_FieldDesc>::Size(&FieldTable);
  if (uVar5 == 0) {
    FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)&afield,&FRegHead,&FRegTail);
    while( true ) {
      pFVar11 = FAutoSegIterator::operator++((FAutoSegIterator *)&afield);
      pvVar12 = FAutoSegIterator::operator*(pFVar11);
      if (pvVar12 == (NCREGINFO)0x0) break;
      pFVar14 = (FieldDesc *)FAutoSegIterator::operator*((FAutoSegIterator *)&afield);
      TArray<FieldDesc,_FieldDesc>::Push(&FieldTable,pFVar14);
    }
    TArray<FieldDesc,_FieldDesc>::ShrinkToFit(&FieldTable);
    pFVar14 = TArray<FieldDesc,_FieldDesc>::operator[](&FieldTable,0);
    uVar5 = TArray<FieldDesc,_FieldDesc>::Size(&FieldTable);
    qsort(pFVar14,(ulong)uVar5,0x20,fieldcmp);
  }
  return;
}

Assistant:

void InitThingdef()
{
	PType *TypeActor = NewPointer(RUNTIME_CLASS(AActor));

	PStruct *sstruct = NewNativeStruct("Sector", nullptr);
	auto sptr = NewPointer(sstruct);
	sstruct->AddNativeField("soundtarget", TypeActor, myoffsetof(sector_t, SoundTarget));
	
	// expose the global validcount variable.
	PField *vcf = new PField("validcount", TypeSInt32, VARF_Native | VARF_Static, (intptr_t)&validcount);
	GlobalSymbols.AddSymbol(vcf);

	// expose the global Multiplayer variable.
	PField *multif = new PField("multiplayer", TypeBool, VARF_Native | VARF_ReadOnly | VARF_Static, (intptr_t)&multiplayer);
	GlobalSymbols.AddSymbol(multif);

	// set up a variable for the global level data structure
	PStruct *lstruct = NewNativeStruct("LevelLocals", nullptr);
	PField *levelf = new PField("level", lstruct, VARF_Native | VARF_Static, (intptr_t)&level);
	GlobalSymbols.AddSymbol(levelf);

	// set up a variable for the DEH data
	PStruct *dstruct = NewNativeStruct("DehInfo", nullptr);
	PField *dehf = new PField("deh", dstruct, VARF_Native | VARF_Static, (intptr_t)&deh);

	GlobalSymbols.AddSymbol(dehf);

	// set up a variable for the global players array.
	PStruct *pstruct = NewNativeStruct("PlayerInfo", nullptr);
	pstruct->Size = sizeof(player_t);
	pstruct->Align = alignof(player_t);
	PArray *parray = NewArray(pstruct, MAXPLAYERS);
	PField *playerf = new PField("players", parray, VARF_Native | VARF_Static, (intptr_t)&players);
	GlobalSymbols.AddSymbol(playerf);

	// set up the lines array in the sector struct. This is a bit messy because the type system is not prepared to handle a pointer to an array of pointers to a native struct even remotely well...
	// As a result, the size has to be set to something large and arbritrary because it can change between maps. This will need some serious improvement when things get cleaned up.
	pstruct = NewNativeStruct("Sector", nullptr);
	pstruct->AddNativeField("lines", NewPointer(NewArray(NewPointer(NewNativeStruct("line", nullptr), false), 0x40000), false), myoffsetof(sector_t, lines), VARF_Native);

	parray = NewArray(TypeBool, MAXPLAYERS);
	playerf = new PField("playeringame", parray, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&playeringame);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("gameaction", TypeUInt8, VARF_Native | VARF_Static, (intptr_t)&gameaction);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("consoleplayer", TypeSInt32, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&consoleplayer);
	GlobalSymbols.AddSymbol(playerf);

	// Argh. It sucks when bad hacks need to be supported. WP_NOCHANGE is just a bogus pointer but it used everywhere as a special flag.
	// It cannot be defined as constant because constants can either be numbers or strings but nothing else, so the only 'solution'
	// is to create a static variable from it and reference that in the script. Yuck!!!
	static AWeapon *wpnochg = WP_NOCHANGE;
	playerf = new PField("WP_NOCHANGE", NewPointer(RUNTIME_CLASS(AWeapon), false), VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&wpnochg);
	GlobalSymbols.AddSymbol(playerf);

	// this needs to be done manually until it can be given a proper type.
	RUNTIME_CLASS(AActor)->AddNativeField("DecalGenerator", NewPointer(TypeVoid), myoffsetof(AActor, DecalGenerator));

	// synthesize a symbol for each flag from the flag name tables to avoid redundant declaration of them.
	for (auto &fl : FlagLists)
	{
		if (fl.Use & 2)
		{
			for(int i=0;i<fl.NumDefs;i++)
			{
				if (fl.Defs[i].structoffset > 0) // skip the deprecated entries in this list
				{
					const_cast<PClass*>(*fl.Type)->AddNativeField(FStringf("b%s", fl.Defs[i].name), (fl.Defs[i].fieldsize == 4 ? TypeSInt32 : TypeSInt16), fl.Defs[i].structoffset, fl.Defs[i].varflags, fl.Defs[i].flagbit);
				}
			}
		}
	}

	FAutoSegIterator probe(CRegHead, CRegTail);

	while (*++probe != NULL)
	{
		if (((ClassReg *)*probe)->InitNatives)
			((ClassReg *)*probe)->InitNatives();
	}

	// Sort the flag lists
	for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
	{
		qsort (FlagLists[i].Defs, FlagLists[i].NumDefs, sizeof(FFlagDef), flagcmp);
	}

	// Create a sorted list of properties
	if (properties.Size() == 0)
	{
		FAutoSegIterator probe(GRegHead, GRegTail);

		while (*++probe != NULL)
		{
			properties.Push((FPropertyInfo *)*probe);
		}
		properties.ShrinkToFit();
		qsort(&properties[0], properties.Size(), sizeof(properties[0]), propcmp);
	}

	// Create a sorted list of native action functions
	AFTable.Clear();
	if (AFTable.Size() == 0)
	{
		FAutoSegIterator probe(ARegHead, ARegTail);

		while (*++probe != NULL)
		{
			AFuncDesc *afunc = (AFuncDesc *)*probe;
			assert(afunc->VMPointer != NULL);
			*(afunc->VMPointer) = new VMNativeFunction(afunc->Function, afunc->FuncName);
			(*(afunc->VMPointer))->PrintableName.Format("%s.%s [Native]", afunc->ClassName+1, afunc->FuncName);
			AFTable.Push(*afunc);
		}
		AFTable.ShrinkToFit();
		qsort(&AFTable[0], AFTable.Size(), sizeof(AFTable[0]), funccmp);
	}

	FieldTable.Clear();
	if (FieldTable.Size() == 0)
	{
		FAutoSegIterator probe(FRegHead, FRegTail);

		while (*++probe != NULL)
		{
			FieldDesc *afield = (FieldDesc *)*probe;
			FieldTable.Push(*afield);
		}
		FieldTable.ShrinkToFit();
		qsort(&FieldTable[0], FieldTable.Size(), sizeof(FieldTable[0]), fieldcmp);
	}

}